

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitGetObjectMethod(RegSlot methodReg,RegSlot objectReg,PropertyId propertyId,
                        ByteCodeGenerator *byteCodeGenerator,FuncInfo *funcInfo)

{
  uint cacheId;
  
  cacheId = FuncInfo::FindOrAddInlineCacheId(funcInfo,objectReg,propertyId,true,false);
  Js::ByteCodeWriter::PatchableProperty
            (&byteCodeGenerator->m_writer,LdMethodFld,methodReg,objectReg,cacheId,false,true);
  return;
}

Assistant:

void EmitGetObjectMethod(
    Js::RegSlot methodReg,
    Js::RegSlot objectReg,
    Js::PropertyId propertyId,
    ByteCodeGenerator* byteCodeGenerator,
    FuncInfo* funcInfo)
{
    uint cacheId = funcInfo->FindOrAddInlineCacheId(
        objectReg,
        propertyId,
        /* isLoadMethod */ true,
        /* isStore */ false);

    byteCodeGenerator->Writer()->PatchableProperty(
        Js::OpCode::LdMethodFld,
        methodReg,
        objectReg,
        cacheId,
        /* isCtor */ false,
        /* registerCacheIdForCall */ true);
}